

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryImagesLoader14.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL::LibraryImagesLoader14::begin__image
          (LibraryImagesLoader14 *this,image__AttributeData *attributeData)

{
  int iVar1;
  byte bVar2;
  uint local_40 [2];
  ParserChar *local_38;
  undefined8 local_30;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  uint64 local_18;
  uint64 local_10;
  uint64 local_8;
  
  local_38 = attributeData->id;
  local_30 = 0;
  local_28 = *(undefined4 *)&attributeData->name;
  uStack_24 = *(undefined4 *)((long)&attributeData->name + 4);
  uStack_20 = *(undefined4 *)&attributeData->format;
  uStack_1c = *(undefined4 *)((long)&attributeData->format + 4);
  local_8 = attributeData->depth;
  bVar2 = (attributeData->present_attributes & 1) != 0;
  if ((bool)bVar2) {
    local_18 = attributeData->height;
  }
  if ((attributeData->present_attributes & 2) != 0) {
    local_10 = attributeData->width;
    bVar2 = bVar2 | 2;
  }
  local_40[0] = (uint)bVar2;
  iVar1 = (*(this->mLoader->super_FilePartLoader).super_IFilePartLoader.super_ExtraDataLoader.
            _vptr_ExtraDataLoader[0xf])(this->mLoader,local_40);
  return SUB41(iVar1,0);
}

Assistant:

bool LibraryImagesLoader14::begin__image( const COLLADASaxFWL14::image__AttributeData& attributeData )
{
SaxVirtualFunctionTest14(begin__image(attributeData));
COLLADASaxFWL::image__AttributeData attrData;
attrData.present_attributes = 0;
attrData.id = attributeData.id;
attrData.name = attributeData.name;
attrData.sid = 0;
attrData.format = attributeData.format;
attrData.depth = attributeData.depth;
if ( (attributeData.present_attributes & COLLADASaxFWL14::image__AttributeData::ATTRIBUTE_HEIGHT_PRESENT) == COLLADASaxFWL14::image__AttributeData::ATTRIBUTE_HEIGHT_PRESENT ) {
    attrData.height = attributeData.height;
    attrData.present_attributes |= COLLADASaxFWL::image__AttributeData::ATTRIBUTE_HEIGHT_PRESENT;
}
if ( (attributeData.present_attributes & COLLADASaxFWL14::image__AttributeData::ATTRIBUTE_WIDTH_PRESENT) == COLLADASaxFWL14::image__AttributeData::ATTRIBUTE_WIDTH_PRESENT ) {
    attrData.width = attributeData.width;
    attrData.present_attributes |= COLLADASaxFWL::image__AttributeData::ATTRIBUTE_WIDTH_PRESENT;
}
return mLoader->begin__image(attrData);
}